

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O0

value_type_conflict1 __thiscall
CCDPP_MPI::rank_one_update
          (CCDPP_MPI *this,
          unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
          *_R,value_type_conflict1 *to_update,value_type_conflict1 *global_the_other,
          int start_to_update_id,int end_to_update_id,int workload)

{
  bool bVar1;
  size_type __n;
  reference pdVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  double value;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  value_type_conflict1 result;
  int thread_index;
  vector<double,_std::allocator<double>_> fun_dec;
  int to_update_size;
  task_type *in_stack_fffffffffffffe98;
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *in_stack_fffffffffffffea0;
  allocator_type *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *this_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_128;
  undefined1 *local_120;
  double local_118;
  type tVar3;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:129:45)_(int)>
  *f;
  function0<void> *this_01;
  int local_68;
  vector<double,_std::allocator<double>_> local_51;
  undefined1 local_2c [44];
  
  local_2c._0_4_ = in_R9D - in_R8D;
  __n = (size_type)
        *(int *)((long)in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 0x24);
  local_51.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._1_8_
       = 0;
  this_00 = &local_51;
  std::allocator<double>::allocator((allocator<double> *)0x19687d);
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,__n,(value_type_conflict1 *)in_RDI,in_stack_fffffffffffffea8);
  std::allocator<double>::~allocator((allocator<double> *)0x1968ab);
  for (local_68 = 0;
      local_68 <
      *(int *)((long)in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 0x24); local_68 = local_68 + 1) {
    tVar3 = (type)((ulong)&stack0x00000008 >> 0x20);
    f = (_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:129:45)_(int)>
         *)local_2c;
    this_01 = (function0<void> *)(local_2c + 8);
    std::
    bind<CCDPP_MPI::rank_one_update(std::unordered_map<int,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>>&,double*,double*,int,int,int)::_lambda(int)_1_,int&>
              ((anon_class_64_8_b0763833_for__M_f *)
               (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,(int *)in_stack_fffffffffffffea0);
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:129:45)_(int)>_>
              (this_01,f,tVar3);
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    boost::function0<void>::~function0((function0<void> *)0x19699b);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
          *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start,(void *)0x0);
  local_118 = 0.0;
  local_120 = (undefined1 *)
              ((long)&local_51.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1);
  local_128._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffea0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffe98);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_128);
    local_118 = *pdVar2 + local_118;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_128);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  return local_118;
}

Assistant:

inline value_type rank_one_update(unordered_map<int, vector<pair<int, value_type > > > &_R, value_type *to_update,
                                      value_type *global_the_other, const int start_to_update_id, const int end_to_update_id, const int workload) {

        int to_update_size = end_to_update_id - start_to_update_id; // exclusive
        vector<value_type> fun_dec(parameter->num_of_thread, 0);

        for(int thread_index=0;thread_index<parameter->num_of_thread;thread_index++){
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(workload + start, to_update_size);

                value_type prev_value;

                for (int to_update_id = start_to_update_id + start; to_update_id < start_to_update_id + end; to_update_id++) {

                    vector<pair<int, value_type > > &vec = _R[to_update_id];

                    // empty column
                    if (vec.size() == 0) {
                        continue;
                    }

                    value_type numerator = 0;
                    value_type denominator = parameter->lambda * vec.size();

                    for (int i = 0; i < vec.size(); i++) {
                        pair<int, value_type > &p = vec[i];

                        numerator += global_the_other[p.first] * p.second;
                        denominator += global_the_other[p.first] * global_the_other[p.first];
                    }

                    int to_update_index = to_update_id - start_to_update_id;
                    prev_value = to_update[to_update_index];
                    to_update[to_update_index] = numerator / denominator;

                    fun_dec[thread_index] += denominator * sqr(prev_value - to_update[to_update_index]);
                }
            },thread_index));
        }

        thread_pool->wait();

        value_type result = 0;
        for (auto value:fun_dec) {
            result += value;
        }
        return result;
    }